

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraction.cpp
# Opt level: O0

void Fraction::Test(void)

{
  double dVar1;
  __type _Var2;
  bool bVar3;
  ostream *poVar4;
  Fraction local_8b0;
  int local_8a8;
  Fraction local_8a4;
  Fraction local_89c;
  int local_894;
  Fraction local_890;
  Fraction local_888;
  int local_880;
  Fraction local_87c;
  Fraction local_874;
  int local_86c;
  Fraction local_868;
  Fraction local_860;
  int local_858;
  Fraction local_854;
  Fraction local_84c;
  int local_844;
  Fraction local_840;
  Fraction local_838;
  int local_830;
  Fraction local_82c;
  Fraction local_824;
  int local_81c;
  Fraction local_818;
  Fraction a_1;
  Fraction local_808;
  Fraction local_800;
  Fraction local_7f8;
  Fraction local_7f0;
  Fraction local_7e8;
  Fraction local_7e0;
  Fraction local_7d8;
  Fraction local_7d0;
  Fraction local_7c8;
  Fraction local_7c0;
  Fraction local_7b8;
  Fraction local_7b0;
  Fraction local_7a8;
  Fraction local_7a0;
  Fraction local_798;
  Fraction local_790;
  Fraction local_788;
  Fraction local_780;
  Fraction local_778;
  Fraction local_770;
  Fraction local_768;
  Fraction local_760;
  Fraction local_758;
  Fraction local_750;
  Fraction a;
  Fraction local_740;
  int local_738;
  Fraction local_734;
  Fraction local_72c;
  Fraction local_724;
  int local_71c;
  Fraction local_718;
  Fraction local_710;
  Fraction local_708;
  int local_700;
  Fraction local_6fc;
  Fraction local_6f4;
  Fraction local_6ec;
  int local_6e4;
  Fraction local_6e0;
  Fraction local_6d8;
  Fraction local_6d0;
  int local_6c8;
  Fraction local_6c4;
  Fraction local_6bc;
  Fraction local_6b4;
  int local_6ac;
  Fraction local_6a8;
  Fraction local_6a0;
  Fraction local_698;
  int local_690;
  Fraction local_68c;
  Fraction local_684;
  Fraction local_67c;
  int local_674;
  Fraction local_670;
  Fraction local_668;
  int local_660;
  Fraction local_65c;
  Fraction local_654;
  Fraction local_64c;
  int local_644;
  Fraction local_640;
  Fraction local_638;
  Fraction local_630;
  int local_628;
  Fraction local_624;
  Fraction local_61c;
  Fraction local_614;
  int local_60c;
  Fraction local_608;
  Fraction local_600;
  Fraction local_5f8;
  int local_5f0;
  Fraction local_5ec;
  Fraction local_5e4;
  Fraction local_5dc;
  int local_5d4;
  Fraction local_5d0;
  Fraction local_5c8;
  Fraction local_5c0;
  int local_5b8;
  Fraction local_5b4;
  Fraction local_5ac;
  Fraction local_5a4;
  int local_59c;
  Fraction local_598;
  Fraction local_590;
  Fraction local_588;
  Fraction local_580;
  Fraction local_578;
  Fraction local_570;
  Fraction local_568;
  Fraction local_560;
  Fraction local_558;
  Fraction local_550;
  Fraction local_548;
  Fraction local_540;
  Fraction local_538;
  Fraction local_530;
  Fraction local_528;
  Fraction local_520;
  Fraction local_518;
  Fraction local_510;
  Fraction local_508;
  Fraction local_500;
  Fraction local_4f8;
  Fraction local_4f0;
  Fraction local_4e8;
  Fraction local_4e0;
  Fraction local_4d8;
  Fraction local_4d0;
  Fraction local_4c8;
  Fraction local_4c0;
  Fraction local_4b8;
  Fraction local_4b0;
  Fraction local_4a8;
  Fraction local_4a0;
  Fraction local_498;
  Fraction local_490;
  Fraction local_488;
  Fraction local_480;
  Fraction local_478;
  Fraction local_470;
  Fraction local_468;
  Fraction local_460;
  Fraction local_458;
  Fraction local_450;
  Fraction local_448;
  Fraction local_440;
  Fraction local_438;
  Fraction local_430;
  Fraction local_428;
  Fraction local_420;
  Fraction local_418;
  Fraction local_410;
  Fraction local_408;
  Fraction local_400;
  Fraction local_3f8;
  Fraction local_3f0;
  Fraction local_3e8;
  Fraction local_3e0;
  Fraction local_3d8;
  Fraction local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  Fraction local_3a4;
  Fraction f;
  int i;
  ostringstream out;
  istringstream local_220 [8];
  istringstream in;
  allocator<char> local_99;
  undefined1 local_98 [8];
  string output;
  allocator<char> local_61;
  string local_60 [8];
  string input;
  int n;
  Fraction local_30;
  Fraction local_28;
  Fraction local_20;
  Fraction local_18;
  undefined8 local_10;
  double eps;
  
  local_10 = 0x3e112e0be826d695;
  Fraction(&local_18,0,1);
  dVar1 = ToDouble(&local_18);
  if (1e-09 <= ABS(dVar1 - 0.0)) {
    __assert_fail("fabs(Fraction(0, 1).ToDouble() - (double) 0) < eps",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0xf6,"static void Fraction::Test()");
  }
  Fraction(&local_20,2,3);
  dVar1 = ToDouble(&local_20);
  if (1e-09 <= ABS(dVar1 - 0.6666666666666666)) {
    __assert_fail("fabs(Fraction(2, 3).ToDouble() - (double) 2 / 3) < eps",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0xf7,"static void Fraction::Test()");
  }
  Fraction(&local_28,-7,3);
  dVar1 = ToDouble(&local_28);
  if (1e-09 <= ABS(dVar1 - -2.3333333333333335)) {
    __assert_fail("fabs(Fraction(-7, 3).ToDouble() - (double) (-7) / 3) < eps",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0xf8,"static void Fraction::Test()");
  }
  Fraction(&local_30,5,-9);
  dVar1 = ToDouble(&local_30);
  if (1e-09 <= ABS(dVar1 - -0.5555555555555556)) {
    __assert_fail("fabs(Fraction(5, -9).ToDouble() - (double) (-5) / 9) < eps",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0xf9,"static void Fraction::Test()");
  }
  Fraction((Fraction *)&stack0xffffffffffffffc8,-3,-0xb);
  dVar1 = ToDouble((Fraction *)&stack0xffffffffffffffc8);
  if (1e-09 <= ABS(dVar1 - 0.2727272727272727)) {
    __assert_fail("fabs(Fraction(-3, -11).ToDouble() - (double) 3 / 11) < eps",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0xfa,"static void Fraction::Test()");
  }
  input.field_2._12_4_ = 6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_60,"6/3 0/6 4/6 -7/3 5/-9 -3/-11",&local_61);
  std::allocator<char>::~allocator(&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_98,"2 0 2/3 -7/3 -5/9 3/11 ",&local_99);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::istringstream::istringstream(local_220,local_60,8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&f.denominator_);
  for (f.numerator_ = 0; f.numerator_ < (int)input.field_2._12_4_; f.numerator_ = f.numerator_ + 1)
  {
    Fraction(&local_3a4);
    operator>>((istream *)local_220,&local_3a4);
    poVar4 = operator<<((ostream *)&f.denominator_,&local_3a4);
    std::operator<<(poVar4," ");
  }
  std::__cxx11::ostringstream::str();
  _Var2 = std::operator==(&local_3c8,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_98);
  if (!_Var2) {
    __assert_fail("out.str() == output",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x109,"static void Fraction::Test()");
  }
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&f.denominator_);
  std::__cxx11::istringstream::~istringstream(local_220);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string(local_60);
  Fraction(&local_3d8,0,1);
  Fraction(&local_3e0,1,3);
  local_3d0 = operator+(&local_3d8,&local_3e0);
  Fraction(&local_3e8,1,3);
  bVar3 = operator==(&local_3d0,&local_3e8);
  if (!bVar3) {
    __assert_fail("Fraction(0, 1) + Fraction(1, 3) == Fraction(1, 3)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x110,"static void Fraction::Test()");
  }
  Fraction(&local_3f8,-5,2);
  Fraction(&local_400,6,5);
  local_3f0 = operator+(&local_3f8,&local_400);
  Fraction(&local_408,-0xd,10);
  bVar3 = operator==(&local_3f0,&local_408);
  if (!bVar3) {
    __assert_fail("Fraction(-5, 2) + Fraction(6, 5) == Fraction(-13, 10)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x111,"static void Fraction::Test()");
  }
  Fraction(&local_418,-5,2);
  Fraction(&local_420,0,1);
  local_410 = ::operator-(&local_418,&local_420);
  Fraction(&local_428,-5,2);
  bVar3 = operator==(&local_410,&local_428);
  if (!bVar3) {
    __assert_fail("Fraction(-5, 2) - Fraction(0, 1) == Fraction(-5, 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x112,"static void Fraction::Test()");
  }
  Fraction(&local_438,3,7);
  Fraction(&local_440,-6,0x19);
  local_430 = ::operator-(&local_438,&local_440);
  Fraction(&local_448,0x75,0xaf);
  bVar3 = operator==(&local_430,&local_448);
  if (!bVar3) {
    __assert_fail("Fraction(3, 7) - Fraction(-6, 25) == Fraction(117, 175)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x113,"static void Fraction::Test()");
  }
  Fraction(&local_458,-5,2);
  Fraction(&local_460,0,5);
  local_450 = operator*(&local_458,&local_460);
  Fraction(&local_468,0,1);
  bVar3 = operator==(&local_450,&local_468);
  if (!bVar3) {
    __assert_fail("Fraction(-5, 2) * Fraction(0, 5) == Fraction(0, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x114,"static void Fraction::Test()");
  }
  Fraction(&local_478,-5,2);
  Fraction(&local_480,-2,5);
  local_470 = operator*(&local_478,&local_480);
  Fraction(&local_488,1,1);
  bVar3 = operator==(&local_470,&local_488);
  if (!bVar3) {
    __assert_fail("Fraction(-5, 2) * Fraction(-2, 5) == Fraction(1, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x115,"static void Fraction::Test()");
  }
  Fraction(&local_498,0,1);
  Fraction(&local_4a0,2,5);
  local_490 = operator/(&local_498,&local_4a0);
  Fraction(&local_4a8,0,1);
  bVar3 = operator==(&local_490,&local_4a8);
  if (!bVar3) {
    __assert_fail("Fraction(0, 1) / Fraction(2, 5) == Fraction(0, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x116,"static void Fraction::Test()");
  }
  Fraction(&local_4b8,-5,2);
  Fraction(&local_4c0,2,5);
  local_4b0 = operator/(&local_4b8,&local_4c0);
  Fraction(&local_4c8,-0x19,4);
  bVar3 = operator==(&local_4b0,&local_4c8);
  if (!bVar3) {
    __assert_fail("Fraction(-5, 2) / Fraction(2, 5) == Fraction(-25, 4)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x117,"static void Fraction::Test()");
  }
  Fraction(&local_4d0,1,3);
  Fraction(&local_4d8,1,3);
  bVar3 = operator==(&local_4d0,&local_4d8);
  if (!bVar3) {
    __assert_fail("Fraction(1, 3) == Fraction(1, 3)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x11a,"static void Fraction::Test()");
  }
  Fraction(&local_4e0,4,2);
  Fraction(&local_4e8,2,1);
  bVar3 = operator==(&local_4e0,&local_4e8);
  if (!bVar3) {
    __assert_fail("Fraction(4, 2) == Fraction(2, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x11b,"static void Fraction::Test()");
  }
  Fraction(&local_4f0,-5,2);
  Fraction(&local_4f8,6,5);
  bVar3 = operator!=(&local_4f0,&local_4f8);
  if (!bVar3) {
    __assert_fail("Fraction(-5, 2) != Fraction(6, 5)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x11c,"static void Fraction::Test()");
  }
  Fraction(&local_500,5,2);
  Fraction(&local_508,0xb,4);
  bVar3 = operator!=(&local_500,&local_508);
  if (!bVar3) {
    __assert_fail("Fraction(5, 2) != Fraction(11, 4)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x11d,"static void Fraction::Test()");
  }
  Fraction(&local_510,-5,2);
  Fraction(&local_518,0,1);
  bVar3 = operator<(&local_510,&local_518);
  if (!bVar3) {
    __assert_fail("Fraction(-5, 2) < Fraction(0, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x11e,"static void Fraction::Test()");
  }
  Fraction(&local_520,3,5);
  Fraction(&local_528,2,3);
  bVar3 = operator<(&local_520,&local_528);
  if (!bVar3) {
    __assert_fail("Fraction(3, 5) < Fraction(2, 3)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x11f,"static void Fraction::Test()");
  }
  Fraction(&local_530,3,7);
  Fraction(&local_538,-6,0x19);
  bVar3 = operator>(&local_530,&local_538);
  if (!bVar3) {
    __assert_fail("Fraction(3, 7) > Fraction(-6, 25)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x120,"static void Fraction::Test()");
  }
  Fraction(&local_540,5,2);
  Fraction(&local_548,0,1);
  bVar3 = operator>(&local_540,&local_548);
  if (!bVar3) {
    __assert_fail("Fraction(5, 2) > Fraction(0, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x121,"static void Fraction::Test()");
  }
  Fraction(&local_550,-1,2);
  Fraction(&local_558,0,1);
  bVar3 = operator<=(&local_550,&local_558);
  if (!bVar3) {
    __assert_fail("Fraction(-1, 2) <= Fraction(0, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x122,"static void Fraction::Test()");
  }
  Fraction(&local_560,-1,2);
  Fraction(&local_568,-4,8);
  bVar3 = operator<=(&local_560,&local_568);
  if (!bVar3) {
    __assert_fail("Fraction(-1, 2) <= Fraction(-4, 8)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x123,"static void Fraction::Test()");
  }
  Fraction(&local_570,-2,5);
  Fraction(&local_578,-5,2);
  bVar3 = operator>=(&local_570,&local_578);
  if (!bVar3) {
    __assert_fail("Fraction(-2, 5) >= Fraction(-5, 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x124,"static void Fraction::Test()");
  }
  Fraction(&local_580,-10,4);
  Fraction(&local_588,-5,2);
  bVar3 = operator>=(&local_580,&local_588);
  if (!bVar3) {
    __assert_fail("Fraction(-10, 4) >= Fraction(-5, 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x125,"static void Fraction::Test()");
  }
  Fraction(&local_598,0,1);
  local_59c = 1;
  local_590 = operator+(&local_598,&local_59c);
  Fraction(&local_5a4,1,1);
  bVar3 = operator==(&local_590,&local_5a4);
  if (!bVar3) {
    __assert_fail("Fraction(0, 1) + 1 == Fraction(1, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x128,"static void Fraction::Test()");
  }
  Fraction(&local_5b4,-5,2);
  local_5b8 = 5;
  local_5ac = operator+(&local_5b4,&local_5b8);
  Fraction(&local_5c0,5,2);
  bVar3 = operator==(&local_5ac,&local_5c0);
  if (!bVar3) {
    __assert_fail("Fraction(-5, 2) + 5 == Fraction(5, 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x129,"static void Fraction::Test()");
  }
  Fraction(&local_5d0,-5,2);
  local_5d4 = 0;
  local_5c8 = ::operator-(&local_5d0,&local_5d4);
  Fraction(&local_5dc,-5,2);
  bVar3 = operator==(&local_5c8,&local_5dc);
  if (!bVar3) {
    __assert_fail("Fraction(-5, 2) - 0 == Fraction(-5, 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x12a,"static void Fraction::Test()");
  }
  Fraction(&local_5ec,3,7);
  local_5f0 = 0x19;
  local_5e4 = ::operator-(&local_5ec,&local_5f0);
  Fraction(&local_5f8,-0xac,7);
  bVar3 = operator==(&local_5e4,&local_5f8);
  if (!bVar3) {
    __assert_fail("Fraction(3, 7) - 25 == Fraction(-172, 7)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,299,"static void Fraction::Test()");
  }
  Fraction(&local_608,-5,2);
  local_60c = 0;
  local_600 = operator*(&local_608,&local_60c);
  Fraction(&local_614,0,1);
  bVar3 = operator==(&local_600,&local_614);
  if (!bVar3) {
    __assert_fail("Fraction(-5, 2) * 0 == Fraction(0, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,300,"static void Fraction::Test()");
  }
  Fraction(&local_624,-5,2);
  local_628 = -2;
  local_61c = operator*(&local_624,&local_628);
  Fraction(&local_630,5,1);
  bVar3 = operator==(&local_61c,&local_630);
  if (!bVar3) {
    __assert_fail("Fraction(-5, 2) * (-2) == Fraction(5, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x12d,"static void Fraction::Test()");
  }
  Fraction(&local_640,0,1);
  local_644 = 5;
  local_638 = operator/(&local_640,&local_644);
  Fraction(&local_64c,0,1);
  bVar3 = operator==(&local_638,&local_64c);
  if (!bVar3) {
    __assert_fail("Fraction(0, 1) / 5 == Fraction(0, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x12e,"static void Fraction::Test()");
  }
  Fraction(&local_65c,-5,2);
  local_660 = 2;
  local_654 = operator/(&local_65c,&local_660);
  Fraction(&local_668,-5,4);
  bVar3 = operator==(&local_654,&local_668);
  if (!bVar3) {
    __assert_fail("Fraction(-5, 2) / 2 == Fraction(-5, 4)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x12f,"static void Fraction::Test()");
  }
  local_674 = 3;
  Fraction(&local_67c,0,1);
  local_670 = operator+(&local_674,&local_67c);
  Fraction(&local_684,3,1);
  bVar3 = operator==(&local_670,&local_684);
  if (!bVar3) {
    __assert_fail("3 + Fraction(0, 1) == Fraction(3, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x132,"static void Fraction::Test()");
  }
  local_690 = 6;
  Fraction(&local_698,-5,2);
  local_68c = operator+(&local_690,&local_698);
  Fraction(&local_6a0,7,2);
  bVar3 = operator==(&local_68c,&local_6a0);
  if (!bVar3) {
    __assert_fail("6 + Fraction(-5, 2) == Fraction(7, 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x133,"static void Fraction::Test()");
  }
  local_6ac = 1;
  Fraction(&local_6b4,-5,2);
  local_6a8 = ::operator-(&local_6ac,&local_6b4);
  Fraction(&local_6bc,7,2);
  bVar3 = operator==(&local_6a8,&local_6bc);
  if (!bVar3) {
    __assert_fail("1 - Fraction(-5, 2) == Fraction(7, 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x134,"static void Fraction::Test()");
  }
  local_6c8 = 0x19;
  Fraction(&local_6d0,3,7);
  local_6c4 = ::operator-(&local_6c8,&local_6d0);
  Fraction(&local_6d8,0xac,7);
  bVar3 = operator==(&local_6c4,&local_6d8);
  if (!bVar3) {
    __assert_fail("25 - Fraction(3, 7) == Fraction(172, 7)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x135,"static void Fraction::Test()");
  }
  local_6e4 = 5;
  Fraction(&local_6ec,-5,2);
  local_6e0 = operator*(&local_6e4,&local_6ec);
  Fraction(&local_6f4,-0x19,2);
  bVar3 = operator==(&local_6e0,&local_6f4);
  if (!bVar3) {
    __assert_fail("5 * Fraction(-5, 2) == Fraction(-25, 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x136,"static void Fraction::Test()");
  }
  local_700 = -5;
  Fraction(&local_708,-5,2);
  local_6fc = operator*(&local_700,&local_708);
  Fraction(&local_710,0x19,2);
  bVar3 = operator==(&local_6fc,&local_710);
  if (!bVar3) {
    __assert_fail("(-5) * Fraction(-5, 2) == Fraction(25, 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x137,"static void Fraction::Test()");
  }
  local_71c = 2;
  Fraction(&local_724,1,1);
  local_718 = operator/(&local_71c,&local_724);
  Fraction(&local_72c,2,1);
  bVar3 = operator==(&local_718,&local_72c);
  if (!bVar3) {
    __assert_fail("2 / Fraction(1, 1) == Fraction(2, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x138,"static void Fraction::Test()");
  }
  local_738 = 2;
  Fraction(&local_740,-5,2);
  local_734 = operator/(&local_738,&local_740);
  Fraction(&a,-4,5);
  bVar3 = operator==(&local_734,&a);
  if (!bVar3) {
    __assert_fail("2 / Fraction(-5, 2) == Fraction(-4, 5)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x139,"static void Fraction::Test()");
  }
  Fraction(&local_750);
  Fraction(&local_758,0,1);
  local_750 = local_758;
  Fraction(&local_760,1,3);
  operator+=(&local_750,&local_760);
  Fraction(&local_768,1,3);
  bVar3 = operator==(&local_750,&local_768);
  if (!bVar3) {
    __assert_fail("a == Fraction(1, 3)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x13f,"static void Fraction::Test()");
  }
  Fraction(&local_770,-5,2);
  local_750 = local_770;
  Fraction(&local_778,6,5);
  operator+=(&local_750,&local_778);
  Fraction(&local_780,-0xd,10);
  bVar3 = operator==(&local_750,&local_780);
  if (!bVar3) {
    __assert_fail("a == Fraction(-13, 10)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x143,"static void Fraction::Test()");
  }
  Fraction(&local_788,-5,2);
  local_750 = local_788;
  Fraction(&local_790,0,1);
  operator-=(&local_750,&local_790);
  Fraction(&local_798,-5,2);
  bVar3 = operator==(&local_750,&local_798);
  if (!bVar3) {
    __assert_fail("a == Fraction(-5, 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x147,"static void Fraction::Test()");
  }
  Fraction(&local_7a0,3,7);
  local_750 = local_7a0;
  Fraction(&local_7a8,-6,0x19);
  operator-=(&local_750,&local_7a8);
  Fraction(&local_7b0,0x75,0xaf);
  bVar3 = operator==(&local_750,&local_7b0);
  if (!bVar3) {
    __assert_fail("a == Fraction(117, 175)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x14b,"static void Fraction::Test()");
  }
  Fraction(&local_7b8,-5,2);
  local_750 = local_7b8;
  Fraction(&local_7c0,0,5);
  operator*=(&local_750,&local_7c0);
  Fraction(&local_7c8,0,1);
  bVar3 = operator==(&local_750,&local_7c8);
  if (!bVar3) {
    __assert_fail("a == Fraction(0, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x14f,"static void Fraction::Test()");
  }
  Fraction(&local_7d0,-5,2);
  local_750 = local_7d0;
  Fraction(&local_7d8,-2,5);
  operator*=(&local_750,&local_7d8);
  Fraction(&local_7e0,1,1);
  bVar3 = operator==(&local_750,&local_7e0);
  if (!bVar3) {
    __assert_fail("a == Fraction(1, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x153,"static void Fraction::Test()");
  }
  Fraction(&local_7e8,0,1);
  local_750 = local_7e8;
  Fraction(&local_7f0,2,5);
  operator/=(&local_750,&local_7f0);
  Fraction(&local_7f8,0,1);
  bVar3 = operator==(&local_750,&local_7f8);
  if (!bVar3) {
    __assert_fail("a == Fraction(0, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x157,"static void Fraction::Test()");
  }
  Fraction(&local_800,-5,2);
  local_750 = local_800;
  Fraction(&local_808,2,5);
  operator/=(&local_750,&local_808);
  Fraction(&a_1,-0x19,4);
  bVar3 = operator==(&local_750,&a_1);
  if (!bVar3) {
    __assert_fail("a == Fraction(-25, 4)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x15b,"static void Fraction::Test()");
  }
  Fraction(&local_818,0,1);
  local_81c = 1;
  operator+=(&local_818,&local_81c);
  Fraction(&local_824,1,1);
  bVar3 = operator==(&local_818,&local_824);
  if (!bVar3) {
    __assert_fail("a == Fraction(1, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x161,"static void Fraction::Test()");
  }
  Fraction(&local_82c,-5,2);
  local_818 = local_82c;
  local_830 = 5;
  operator+=(&local_818,&local_830);
  Fraction(&local_838,5,2);
  bVar3 = operator==(&local_818,&local_838);
  if (!bVar3) {
    __assert_fail("a == Fraction(5, 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x165,"static void Fraction::Test()");
  }
  Fraction(&local_840,-5,2);
  local_818 = local_840;
  local_844 = 0;
  operator-=(&local_818,&local_844);
  Fraction(&local_84c,-5,2);
  bVar3 = operator==(&local_818,&local_84c);
  if (!bVar3) {
    __assert_fail("a == Fraction(-5, 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x169,"static void Fraction::Test()");
  }
  Fraction(&local_854,3,7);
  local_818 = local_854;
  local_858 = 0x19;
  operator-=(&local_818,&local_858);
  Fraction(&local_860,-0xac,7);
  bVar3 = operator==(&local_818,&local_860);
  if (!bVar3) {
    __assert_fail("a == Fraction(-172, 7)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x16d,"static void Fraction::Test()");
  }
  Fraction(&local_868,-5,2);
  local_818 = local_868;
  local_86c = 0;
  operator*=(&local_818,&local_86c);
  Fraction(&local_874,0,1);
  bVar3 = operator==(&local_818,&local_874);
  if (!bVar3) {
    __assert_fail("a == Fraction(0, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x171,"static void Fraction::Test()");
  }
  Fraction(&local_87c,-5,2);
  local_818 = local_87c;
  local_880 = -2;
  operator*=(&local_818,&local_880);
  Fraction(&local_888,5,1);
  bVar3 = operator==(&local_818,&local_888);
  if (!bVar3) {
    __assert_fail("a == Fraction(5, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x175,"static void Fraction::Test()");
  }
  Fraction(&local_890,0,1);
  local_818 = local_890;
  local_894 = 5;
  operator/=(&local_818,&local_894);
  Fraction(&local_89c,0,1);
  bVar3 = operator==(&local_818,&local_89c);
  if (!bVar3) {
    __assert_fail("a == Fraction(0, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x179,"static void Fraction::Test()");
  }
  Fraction(&local_8a4,-5,2);
  local_818 = local_8a4;
  local_8a8 = 2;
  operator/=(&local_818,&local_8a8);
  Fraction(&local_8b0,-5,4);
  bVar3 = operator==(&local_818,&local_8b0);
  if (!bVar3) {
    __assert_fail("a == Fraction(-5, 4)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x17d,"static void Fraction::Test()");
  }
  return;
}

Assistant:

void Fraction::Test() {
  {//Test Case 1
    const double eps = 1e-9;
    assert(fabs(Fraction(0, 1).ToDouble() - (double) 0) < eps);
    assert(fabs(Fraction(2, 3).ToDouble() - (double) 2 / 3) < eps);
    assert(fabs(Fraction(-7, 3).ToDouble() - (double) (-7) / 3) < eps);
    assert(fabs(Fraction(5, -9).ToDouble() - (double) (-5) / 9) < eps);
    assert(fabs(Fraction(-3, -11).ToDouble() - (double) 3 / 11) < eps);
  }
  {//Test Case 2
    int n = 6;
    std::string input = "6/3 0/6 4/6 -7/3 5/-9 -3/-11";
    std::string output = "2 0 2/3 -7/3 -5/9 3/11 ";

    std::istringstream in(input);
    std::ostringstream out;
    for (int i = 0; i < n; i++) {
      Fraction f;
      in >> f;
      out << f << " ";
    }

    assert(out.str() == output);
  }
  //Test Case 3
  {
    //TODO
  }
  {//Test Case 4
    assert(Fraction(0, 1) + Fraction(1, 3) == Fraction(1, 3));
    assert(Fraction(-5, 2) + Fraction(6, 5) == Fraction(-13, 10));
    assert(Fraction(-5, 2) - Fraction(0, 1) == Fraction(-5, 2));
    assert(Fraction(3, 7) - Fraction(-6, 25) == Fraction(117, 175));
    assert(Fraction(-5, 2) * Fraction(0, 5) == Fraction(0, 1));
    assert(Fraction(-5, 2) * Fraction(-2, 5) == Fraction(1, 1));
    assert(Fraction(0, 1) / Fraction(2, 5) == Fraction(0, 1));
    assert(Fraction(-5, 2) / Fraction(2, 5) == Fraction(-25, 4));
  }
  {//Test Case 5
    assert(Fraction(1, 3) == Fraction(1, 3));
    assert(Fraction(4, 2) == Fraction(2, 1));
    assert(Fraction(-5, 2) != Fraction(6, 5));
    assert(Fraction(5, 2) != Fraction(11, 4));
    assert(Fraction(-5, 2) < Fraction(0, 1));
    assert(Fraction(3, 5) < Fraction(2, 3));
    assert(Fraction(3, 7) > Fraction(-6, 25));
    assert(Fraction(5, 2) > Fraction(0, 1));
    assert(Fraction(-1, 2) <= Fraction(0, 1));
    assert(Fraction(-1, 2) <= Fraction(-4, 8));
    assert(Fraction(-2, 5) >= Fraction(-5, 2));
    assert(Fraction(-10, 4) >= Fraction(-5, 2));
  }
  {//Test Case 6
    assert(Fraction(0, 1) + 1 == Fraction(1, 1));
    assert(Fraction(-5, 2) + 5 == Fraction(5, 2));
    assert(Fraction(-5, 2) - 0 == Fraction(-5, 2));
    assert(Fraction(3, 7) - 25 == Fraction(-172, 7));
    assert(Fraction(-5, 2) * 0 == Fraction(0, 1));
    assert(Fraction(-5, 2) * (-2) == Fraction(5, 1));
    assert(Fraction(0, 1) / 5 == Fraction(0, 1));
    assert(Fraction(-5, 2) / 2 == Fraction(-5, 4));
  }
  {//Test Case 7
    assert(3 + Fraction(0, 1) == Fraction(3, 1));
    assert(6 + Fraction(-5, 2) == Fraction(7, 2));
    assert(1 - Fraction(-5, 2) == Fraction(7, 2));
    assert(25 - Fraction(3, 7) == Fraction(172, 7));
    assert(5 * Fraction(-5, 2) == Fraction(-25, 2));
    assert((-5) * Fraction(-5, 2) == Fraction(25, 2));
    assert(2 / Fraction(1, 1) == Fraction(2, 1));
    assert(2 / Fraction(-5, 2) == Fraction(-4, 5));
  }
  {//Test Case 8
    Fraction a;
    a = Fraction(0, 1);
    a += Fraction(1, 3);
    assert(a == Fraction(1, 3));

    a = Fraction(-5, 2);
    a += Fraction(6, 5);
    assert(a == Fraction(-13, 10));

    a = Fraction(-5, 2);
    a -= Fraction(0, 1);
    assert(a == Fraction(-5, 2));

    a = Fraction(3, 7);
    a -= Fraction(-6, 25);
    assert(a == Fraction(117, 175));

    a = Fraction(-5, 2);
    a *= Fraction(0, 5);
    assert(a == Fraction(0, 1));

    a = Fraction(-5, 2);
    a *= Fraction(-2, 5);
    assert(a == Fraction(1, 1));

    a = Fraction(0, 1);
    a /= Fraction(2, 5);
    assert(a == Fraction(0, 1));

    a = Fraction(-5, 2);
    a /= Fraction(2, 5);
    assert(a == Fraction(-25, 4));
  }

  {//Test Case 9
    Fraction a = Fraction(0, 1);
    a += 1;
    assert(a == Fraction(1, 1));

    a = Fraction(-5, 2);
    a += 5;
    assert(a == Fraction(5, 2));

    a = Fraction(-5, 2);
    a -= 0;
    assert(a == Fraction(-5, 2));

    a = Fraction(3, 7);
    a -= 25;
    assert(a == Fraction(-172, 7));

    a = Fraction(-5, 2);
    a *= 0;
    assert(a == Fraction(0, 1));

    a = Fraction(-5, 2);
    a *= (-2);
    assert(a == Fraction(5, 1));

    a = Fraction(0, 1);
    a /= 5;
    assert(a == Fraction(0, 1));

    a = Fraction(-5, 2);
    a /= 2;
    assert(a == Fraction(-5, 4));
  }
}